

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::train(FastText *this,Args *args)

{
  bool bVar1;
  byte bVar2;
  element_type *peVar3;
  invalid_argument *piVar4;
  ulong uVar5;
  shared_ptr<fasttext::Matrix> *in_RDI;
  bool normalizeGradient;
  shared_ptr<fasttext::Loss> loss;
  ifstream ifs;
  string *in_stack_00000170;
  FastText *in_stack_00000178;
  shared_ptr<fasttext::Args> *in_stack_fffffffffffffcf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd00;
  shared_ptr<fasttext::Matrix> *this_00;
  undefined7 in_stack_fffffffffffffd20;
  Args *in_stack_fffffffffffffd28;
  element_type *in_stack_fffffffffffffd38;
  undefined7 in_stack_fffffffffffffd48;
  undefined1 in_stack_fffffffffffffd4f;
  shared_ptr<fasttext::Matrix> local_2a0 [3];
  undefined7 in_stack_fffffffffffffd90;
  undefined1 in_stack_fffffffffffffd97;
  istream *in_stack_fffffffffffffd98;
  Dictionary *in_stack_fffffffffffffda0;
  undefined1 local_248 [24];
  shared_ptr<fasttext::Matrix> *in_stack_fffffffffffffdd0;
  FastText *in_stack_fffffffffffffdd8;
  
  std::make_shared<fasttext::Args,fasttext::Args_const&>(in_stack_fffffffffffffd28);
  std::shared_ptr<fasttext::Args>::operator=
            ((shared_ptr<fasttext::Args> *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  std::shared_ptr<fasttext::Args>::~shared_ptr((shared_ptr<fasttext::Args> *)0x174868);
  std::make_shared<fasttext::Dictionary,std::shared_ptr<fasttext::Args>&>
            ((shared_ptr<fasttext::Args> *)in_stack_fffffffffffffd28);
  std::shared_ptr<fasttext::Dictionary>::operator=
            ((shared_ptr<fasttext::Dictionary> *)in_stack_fffffffffffffd00,
             (shared_ptr<fasttext::Dictionary> *)in_stack_fffffffffffffcf8);
  std::shared_ptr<fasttext::Dictionary>::~shared_ptr((shared_ptr<fasttext::Dictionary> *)0x17489d);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1748a7);
  bVar1 = std::operator==(in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8);
  if (bVar1) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar4,"Cannot use stdin for training!");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x174924);
  std::ifstream::ifstream(local_248,(string *)peVar3,_S_in);
  bVar2 = std::ifstream::is_open();
  if ((bVar2 & 1) == 0) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x17497d);
    std::operator+(&in_stack_fffffffffffffd28->input,
                   (char *)CONCAT17(bVar2,in_stack_fffffffffffffd20));
    std::invalid_argument::invalid_argument(piVar4,(string *)&stack0xfffffffffffffd98);
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x174a48);
  Dictionary::readFromFile(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  std::ifstream::close();
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x174a73);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x174a90);
    getInputMatrixFromFile(in_stack_00000178,in_stack_00000170);
    std::shared_ptr<fasttext::Matrix>::operator=
              ((shared_ptr<fasttext::Matrix> *)in_stack_fffffffffffffd00,
               (shared_ptr<fasttext::Matrix> *)in_stack_fffffffffffffcf8);
    std::shared_ptr<fasttext::Matrix>::~shared_ptr((shared_ptr<fasttext::Matrix> *)0x174ad1);
  }
  else {
    createRandomMatrix((FastText *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
    std::shared_ptr<fasttext::Matrix>::operator=
              ((shared_ptr<fasttext::Matrix> *)in_stack_fffffffffffffd00,
               (shared_ptr<fasttext::Matrix> *)in_stack_fffffffffffffcf8);
    std::shared_ptr<fasttext::Matrix>::~shared_ptr((shared_ptr<fasttext::Matrix> *)0x174b01);
  }
  createTrainOutputMatrix((FastText *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48))
  ;
  this_00 = local_2a0;
  std::shared_ptr<fasttext::Matrix>::operator=
            (this_00,(shared_ptr<fasttext::Matrix> *)in_stack_fffffffffffffcf8);
  std::shared_ptr<fasttext::Matrix>::~shared_ptr((shared_ptr<fasttext::Matrix> *)0x174b39);
  createLoss(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x174b59);
  std::
  make_shared<fasttext::Model,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Loss>&,bool&>
            (&in_stack_fffffffffffffd38->wi_,in_RDI,
             (shared_ptr<fasttext::Loss> *)in_stack_fffffffffffffd28,
             (bool *)CONCAT17(bVar2,in_stack_fffffffffffffd20));
  std::shared_ptr<fasttext::Model>::operator=
            ((shared_ptr<fasttext::Model> *)this_00,
             (shared_ptr<fasttext::Model> *)&stack0xfffffffffffffd38);
  std::shared_ptr<fasttext::Model>::~shared_ptr((shared_ptr<fasttext::Model> *)0x174baa);
  startThreads((FastText *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
  std::shared_ptr<fasttext::Loss>::~shared_ptr((shared_ptr<fasttext::Loss> *)0x174bc0);
  std::ifstream::~ifstream(local_248);
  return;
}

Assistant:

void FastText::train(const Args& args) {
  args_ = std::make_shared<Args>(args);
  dict_ = std::make_shared<Dictionary>(args_);
  if (args_->input == "-") {
    // manage expectations
    throw std::invalid_argument("Cannot use stdin for training!");
  }
  std::ifstream ifs(args_->input);
  if (!ifs.is_open()) {
    throw std::invalid_argument(
        args_->input + " cannot be opened for training!");
  }
  dict_->readFromFile(ifs);
  ifs.close();

  if (!args_->pretrainedVectors.empty()) {
    input_ = getInputMatrixFromFile(args_->pretrainedVectors);
  } else {
    input_ = createRandomMatrix();
  }
  output_ = createTrainOutputMatrix();
  auto loss = createLoss(output_);
  bool normalizeGradient = (args_->model == model_name::sup);
  model_ = std::make_shared<Model>(input_, output_, loss, normalizeGradient);
  startThreads();
}